

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void * map_remove(Map *map,void *key)

{
  List *list;
  unsigned_long uVar1;
  unsigned_long uVar2;
  void *value;
  undefined8 *puStack_30;
  int i;
  Elem *elem;
  List *els;
  void *key_local;
  Map *map_local;
  
  list = map_get_(map,key);
  if (list == (List *)0x0) {
    map_local = (Map *)0x0;
  }
  else {
    for (value._4_4_ = 0; value._4_4_ < list->size; value._4_4_ = value._4_4_ + 1) {
      puStack_30 = (undefined8 *)list_get(list,value._4_4_);
      if (puStack_30 == (undefined8 *)0x0) {
        return (void *)0x0;
      }
      uVar1 = hash((void *)*puStack_30);
      uVar2 = hash(key);
      if (uVar1 == uVar2) {
        list_remove(list,value._4_4_);
        break;
      }
    }
    map_local = (Map *)puStack_30[1];
    free(puStack_30);
    map->size = map->size - 1;
  }
  return map_local;
}

Assistant:

void *map_remove(Map *map, void *key) {
    List *els = map_get_(map, key);
    if (els == NULL)return NULL;
    Elem *elem;
    for (int i = 0; i < els->size; ++i) {
        elem = list_get(els, i);
        if (elem == NULL)return NULL;
        if (hash(elem->key) == hash(key)) {
            list_remove(els, i);
            break;
        }
    }
    void *value = elem->value;
    free(elem);
    map->size--;
    return value;
}